

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

void nn_sock_stopped(nn_sock *self)

{
  (self->fsm).stopped.fsm = &self->fsm;
  (self->fsm).stopped.src = -2;
  (self->fsm).stopped.srcptr = (void *)0x0;
  (self->fsm).stopped.type = 1;
  nn_ctx_raise((self->fsm).ctx,&(self->fsm).stopped);
  return;
}

Assistant:

void nn_sock_stopped (struct nn_sock *self)
{
    /*  TODO: Do the following in a more sane way. */
    self->fsm.stopped.fsm = &self->fsm;
    self->fsm.stopped.src = NN_FSM_ACTION;
    self->fsm.stopped.srcptr = NULL;
    self->fsm.stopped.type = NN_SOCK_ACTION_STOPPED;
    nn_ctx_raise (self->fsm.ctx, &self->fsm.stopped);
}